

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O2

void bench_rfc6979_hmac_sha256(void *arg,int iters)

{
  size_t outlen;
  int iVar1;
  bool bVar2;
  secp256k1_rfc6979_hmac_sha256 rng;
  
  iVar1 = 0;
  if (0 < iters) {
    iVar1 = iters;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_rfc6979_hmac_sha256_initialize(&rng,(uchar *)((long)arg + 0x290),0x40);
    secp256k1_rfc6979_hmac_sha256_generate(&rng,(uchar *)((long)arg + 0x290),outlen);
  }
  return;
}

Assistant:

static void bench_rfc6979_hmac_sha256(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_rfc6979_hmac_sha256 rng;

    for (i = 0; i < iters; i++) {
        secp256k1_rfc6979_hmac_sha256_initialize(&rng, data->data, 64);
        secp256k1_rfc6979_hmac_sha256_generate(&rng, data->data, 32);
    }
}